

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bucket.cpp
# Opt level: O2

void __thiscall bucket::insert(bucket *this,index index)

{
  value_type local_18;
  
  local_18.value = index.value;
  local_18._0_8_ = index._0_8_;
  std::vector<index,_std::allocator<index>_>::push_back(&this->indices,&local_18);
  this->size = this->size + '\x01';
  return;
}

Assistant:

void bucket::insert(index index) {
    indices.push_back(index);
    size++;
}